

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseArgumentsCommand.cxx
# Opt level: O2

bool __thiscall
cmParseArgumentsCommand::InitialPass
          (cmParseArgumentsCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  cmMakefile *pcVar2;
  pointer pbVar3;
  bool escape;
  bool bVar4;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  _Var5;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var6;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  _Var7;
  string *psVar8;
  ostream *poVar9;
  char *pcVar10;
  _Base_ptr p_Var11;
  string *this_00;
  string *key_2;
  ulong uVar12;
  pointer pbVar13;
  string *key_1;
  string *key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  unsigned_long uVar14;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_bool>
  pVar15;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar16;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_bool>
  pVar17;
  string_view name;
  string_view name_00;
  string_view name_01;
  string argc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2f8;
  unsigned_long argvStart;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unparsed;
  UserArgumentParser parser;
  string prefix;
  char *arg;
  unsigned_long count;
  options_map options;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keywordsMissingValues;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  multi_map multiValArgs;
  single_map singleValArgs;
  ostringstream argName;
  size_type sStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  long local_180;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar12 = (long)pbVar1 - (long)__lhs;
  if (uVar12 < 0x61) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&argName,"must be called with at least 4 arguments.",
               (allocator<char> *)&options);
    cmCommand::SetError(&this->super_cmCommand,(string *)&argName);
    psVar8 = (string *)&argName;
  }
  else {
    argvStart = 0;
    escape = std::operator==(__lhs,"PARSE_ARGV");
    if (escape) {
      if ((long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start == 0xc0) {
        bVar4 = cmSystemTools::StringToULong(__lhs[1]._M_dataplus._M_p,&argvStart);
        if (bVar4) {
          __lhs = __lhs + 2;
          goto LAB_001faf26;
        }
        pcVar2 = (this->super_cmCommand).Makefile;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&options
                       ,"PARSE_ARGV index \'",__lhs + 1);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&argName
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &options,"\' is not an unsigned integer");
        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&argName);
        std::__cxx11::string::~string((string *)&argName);
        this_00 = (string *)&options;
      }
      else {
        pcVar2 = (this->super_cmCommand).Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&argName,"PARSE_ARGV must be called with exactly 6 arguments.",
                   (allocator<char> *)&options);
        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&argName);
        this_00 = (string *)&argName;
      }
      std::__cxx11::string::~string(this_00);
      cmSystemTools::s_FatalErrorOccured = true;
      goto LAB_001fb8c4;
    }
LAB_001faf26:
    std::operator+(&prefix,__lhs,"_");
    parser.super_cmArgumentParser<void>.Bindings.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    options._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &options._M_t._M_impl.super__Rb_tree_header._M_header;
    options._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    options._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    singleValArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &singleValArgs._M_t._M_impl.super__Rb_tree_header._M_header;
    singleValArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    singleValArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    singleValArgs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    multiValArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &multiValArgs._M_t._M_impl.super__Rb_tree_header._M_header;
    multiValArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    multiValArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    parser.super_cmArgumentParser<void>.Bindings.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    parser.super_cmArgumentParser<void>.Bindings.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    multiValArgs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    unparsed.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    unparsed.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    unparsed.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    options._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         options._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    multiValArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         multiValArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    singleValArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         singleValArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    cmSystemTools::ExpandListArgument(__lhs + 1,&list,false);
    pbVar3 = list.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_2f8 = __lhs + 2;
    _argName = (pointer)this;
    for (pbVar13 = list.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar3;
        pbVar13 = pbVar13 + 1) {
      argc._M_dataplus._M_p = argc._M_dataplus._M_p & 0xffffffffffffff00;
      pVar15 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::_Select1st<std::pair<std::__cxx11::string_const,bool>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
               ::_M_emplace_unique<std::__cxx11::string_const&,bool>
                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::_Select1st<std::pair<std::__cxx11::string_const,bool>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
                           *)&options,pbVar13,(bool *)&argc);
      _Var5 = pVar15.first._M_node;
      name._M_str = *(char **)(_Var5._M_node + 1);
      name._M_len = (size_t)_Var5._M_node[1]._M_parent;
      bVar4 = cmArgumentParser<void>::Bind<bool>
                        (&parser.super_cmArgumentParser<void>,name,(bool *)(_Var5._M_node + 2));
      if (!bVar4) {
        InitialPass::anon_class_8_1_8991fb9c::operator()
                  ((anon_class_8_1_8991fb9c *)&argName,pbVar13);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&list);
    cmSystemTools::ExpandListArgument(local_2f8,&list,false);
    pbVar3 = list.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_2f8 = __lhs + 3;
    argc._M_dataplus._M_p = (pointer)this;
    for (pbVar13 = list.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar3;
        pbVar13 = pbVar13 + 1) {
      _argName = (pointer)&local_198;
      sStack_1a0 = 0;
      local_198._M_allocated_capacity = local_198._M_allocated_capacity & 0xffffffffffffff00;
      pVar16 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
               ::_M_emplace_unique<std::__cxx11::string_const&,std::__cxx11::string>
                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                           *)&singleValArgs,pbVar13,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &argName);
      _Var6 = pVar16.first._M_node;
      std::__cxx11::string::~string((string *)&argName);
      name_00._M_str = *(char **)(_Var6._M_node + 1);
      name_00._M_len = (size_t)_Var6._M_node[1]._M_parent;
      bVar4 = cmArgumentParser<void>::Bind<std::__cxx11::string>
                        (&parser.super_cmArgumentParser<void>,name_00,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (_Var6._M_node + 2));
      if (!bVar4) {
        InitialPass::anon_class_8_1_8991fb9c::operator()((anon_class_8_1_8991fb9c *)&argc,pbVar13);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&list);
    cmSystemTools::ExpandListArgument(local_2f8,&list,false);
    pbVar3 = list.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    psVar8 = __lhs + 4;
    argc._M_dataplus._M_p = (pointer)this;
    for (pbVar13 = list.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar3;
        pbVar13 = pbVar13 + 1) {
      _argName = (pointer)0x0;
      sStack_1a0 = 0;
      local_198._M_allocated_capacity = 0;
      pVar17 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
               ::
               _M_emplace_unique<std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                           *)&multiValArgs,pbVar13,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&argName);
      _Var7 = pVar17.first._M_node;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&argName);
      name_01._M_str = *(char **)(_Var7._M_node + 1);
      name_01._M_len = (size_t)_Var7._M_node[1]._M_parent;
      bVar4 = cmArgumentParser<void>::
              Bind<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        (&parser.super_cmArgumentParser<void>,name_01,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(_Var7._M_node + 2));
      if (!bVar4) {
        InitialPass::anon_class_8_1_8991fb9c::operator()((anon_class_8_1_8991fb9c *)&argc,pbVar13);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&list);
    if (escape) {
      pcVar2 = (this->super_cmCommand).Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&argName,"ARGC",(allocator<char> *)&local_318);
      psVar8 = cmMakefile::GetSafeDefinition(pcVar2,(string *)&argName);
      std::__cxx11::string::string((string *)&argc,(string *)psVar8);
      std::__cxx11::string::~string((string *)&argName);
      bVar4 = cmSystemTools::StringToULong(argc._M_dataplus._M_p,&count);
      if (bVar4) {
        uVar14 = argvStart;
        do {
          if (count <= uVar14) {
            std::__cxx11::string::~string((string *)&argc);
            goto LAB_001fb54e;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&argName);
          poVar9 = std::operator<<((ostream *)&argName,"ARGV");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          pcVar2 = (this->super_cmCommand).Makefile;
          std::__cxx11::stringbuf::str();
          pcVar10 = cmMakefile::GetDefinition(pcVar2,&local_318);
          std::__cxx11::string::~string((string *)&local_318);
          arg = pcVar10;
          if (pcVar10 == (char *)0x0) {
            pcVar2 = (this->super_cmCommand).Makefile;
            std::__cxx11::stringbuf::str();
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &keywordsMissingValues,"PARSE_ARGV called with ",&local_228);
            std::operator+(&local_318,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &keywordsMissingValues," not set");
            cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_318);
            std::__cxx11::string::~string((string *)&local_318);
            std::__cxx11::string::~string((string *)&keywordsMissingValues);
            std::__cxx11::string::~string((string *)&local_228);
            cmSystemTools::s_FatalErrorOccured = true;
          }
          else {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const*&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&list,
                       &arg);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&argName);
          uVar14 = uVar14 + 1;
        } while (pcVar10 != (char *)0x0);
        std::__cxx11::string::~string((string *)&argc);
      }
      else {
        pcVar2 = (this->super_cmCommand).Makefile;
        std::operator+(&local_318,"PARSE_ARGV called with ARGC=\'",&argc);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&argName
                       ,&local_318,"\' that is not an unsigned integer");
        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&argName);
        std::__cxx11::string::~string((string *)&argName);
        std::__cxx11::string::~string((string *)&local_318);
        cmSystemTools::s_FatalErrorOccured = true;
        std::__cxx11::string::~string((string *)&argc);
      }
    }
    else {
      for (; psVar8 != pbVar1; psVar8 = psVar8 + 1) {
        cmSystemTools::ExpandListArgument(psVar8,&list,false);
      }
LAB_001fb54e:
      keywordsMissingValues.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      keywordsMissingValues.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      keywordsMissingValues.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmArgumentParser<void>::
      Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&parser.super_cmArgumentParser<void>,&list,&unparsed,&keywordsMissingValues);
      pcVar2 = (this->super_cmCommand).Makefile;
      std::
      set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::
      set<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&argName,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )keywordsMissingValues.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )keywordsMissingValues.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      for (p_Var11 = options._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var11 != &options._M_t._M_impl.super__Rb_tree_header;
          p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
        std::operator+(&argc,&prefix,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var11 + 1));
        pcVar10 = "FALSE";
        if ((char)p_Var11[2]._M_color != _S_red) {
          pcVar10 = "TRUE";
        }
        cmMakefile::AddDefinition(pcVar2,&argc,pcVar10);
        std::__cxx11::string::~string((string *)&argc);
      }
      for (p_Var11 = singleValArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var11 != &singleValArgs._M_t._M_impl.super__Rb_tree_header;
          p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
        if (p_Var11[2]._M_parent == (_Base_ptr)0x0) {
          std::operator+(&argc,&prefix,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var11 + 1));
          cmMakefile::RemoveDefinition(pcVar2,&argc);
        }
        else {
          std::operator+(&argc,&prefix,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var11 + 1));
          cmMakefile::AddDefinition(pcVar2,&argc,*(char **)(p_Var11 + 2));
        }
        std::__cxx11::string::~string((string *)&argc);
      }
      for (p_Var11 = multiValArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var11 != &multiValArgs._M_t._M_impl.super__Rb_tree_header;
          p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
        if (*(_Base_ptr *)(p_Var11 + 2) == p_Var11[2]._M_parent) {
          std::operator+(&argc,&prefix,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var11 + 1));
          cmMakefile::RemoveDefinition(pcVar2,&argc);
        }
        else {
          std::operator+(&argc,&prefix,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var11 + 1));
          JoinList(&local_318,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(p_Var11 + 2),escape);
          cmMakefile::AddDefinition(pcVar2,&argc,local_318._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_318);
        }
        std::__cxx11::string::~string((string *)&argc);
      }
      if (unparsed.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          unparsed.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::operator+(&argc,&prefix,"UNPARSED_ARGUMENTS");
        cmMakefile::RemoveDefinition(pcVar2,&argc);
      }
      else {
        std::operator+(&argc,&prefix,"UNPARSED_ARGUMENTS");
        JoinList(&local_318,&unparsed,escape);
        cmMakefile::AddDefinition(pcVar2,&argc,local_318._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_318);
      }
      std::__cxx11::string::~string((string *)&argc);
      if (local_180 == 0) {
        std::operator+(&argc,&prefix,"KEYWORDS_MISSING_VALUES");
        cmMakefile::RemoveDefinition(pcVar2,&argc);
      }
      else {
        std::operator+(&argc,&prefix,"KEYWORDS_MISSING_VALUES");
        local_228._M_string_length = (size_type)&sStack_1a0;
        local_228._M_dataplus._M_p = (pointer)local_198._8_8_;
        cmJoin<cmRange<std::_Rb_tree_const_iterator<std::__cxx11::string>>>
                  (&local_318,
                   (cmRange<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_228,";");
        cmMakefile::AddDefinition(pcVar2,&argc,local_318._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_318);
      }
      std::__cxx11::string::~string((string *)&argc);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&argName);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&keywordsMissingValues);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&list);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&unparsed);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&multiValArgs._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&singleValArgs._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::~_Rb_tree(&options._M_t);
    std::
    vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
               *)&parser);
    psVar8 = &prefix;
  }
  std::__cxx11::string::~string((string *)psVar8);
LAB_001fb8c4:
  return 0x60 < uVar12;
}

Assistant:

bool cmParseArgumentsCommand::InitialPass(std::vector<std::string> const& args,
                                          cmExecutionStatus&)
{
  // cmake_parse_arguments(prefix options single multi <ARGN>)
  //                         1       2      3      4
  // or
  // cmake_parse_arguments(PARSE_ARGV N prefix options single multi)
  if (args.size() < 4) {
    this->SetError("must be called with at least 4 arguments.");
    return false;
  }

  std::vector<std::string>::const_iterator argIter = args.begin(),
                                           argEnd = args.end();
  bool parseFromArgV = false;
  unsigned long argvStart = 0;
  if (*argIter == "PARSE_ARGV") {
    if (args.size() != 6) {
      this->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        "PARSE_ARGV must be called with exactly 6 arguments.");
      cmSystemTools::SetFatalErrorOccured();
      return true;
    }
    parseFromArgV = true;
    argIter++; // move past PARSE_ARGV
    if (!cmSystemTools::StringToULong(argIter->c_str(), &argvStart)) {
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                   "PARSE_ARGV index '" + *argIter +
                                     "' is not an unsigned integer");
      cmSystemTools::SetFatalErrorOccured();
      return true;
    }
    argIter++; // move past N
  }
  // the first argument is the prefix
  const std::string prefix = (*argIter++) + "_";

  UserArgumentParser parser;

  // define the result maps holding key/value pairs for
  // options, single values and multi values
  options_map options;
  single_map singleValArgs;
  multi_map multiValArgs;

  // anything else is put into a vector of unparsed strings
  std::vector<std::string> unparsed;

  auto const duplicateKey = [this](std::string const& key) {
    this->GetMakefile()->IssueMessage(
      MessageType::WARNING, "keyword defined more than once: " + key);
  };

  // the second argument is a (cmake) list of options without argument
  std::vector<std::string> list;
  cmSystemTools::ExpandListArgument(*argIter++, list);
  parser.Bind(list, options, duplicateKey);

  // the third argument is a (cmake) list of single argument options
  list.clear();
  cmSystemTools::ExpandListArgument(*argIter++, list);
  parser.Bind(list, singleValArgs, duplicateKey);

  // the fourth argument is a (cmake) list of multi argument options
  list.clear();
  cmSystemTools::ExpandListArgument(*argIter++, list);
  parser.Bind(list, multiValArgs, duplicateKey);

  list.clear();
  if (!parseFromArgV) {
    // Flatten ;-lists in the arguments into a single list as was done
    // by the original function(CMAKE_PARSE_ARGUMENTS).
    for (; argIter != argEnd; ++argIter) {
      cmSystemTools::ExpandListArgument(*argIter, list);
    }
  } else {
    // in the PARSE_ARGV move read the arguments from ARGC and ARGV#
    std::string argc = this->Makefile->GetSafeDefinition("ARGC");
    unsigned long count;
    if (!cmSystemTools::StringToULong(argc.c_str(), &count)) {
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                   "PARSE_ARGV called with ARGC='" + argc +
                                     "' that is not an unsigned integer");
      cmSystemTools::SetFatalErrorOccured();
      return true;
    }
    for (unsigned long i = argvStart; i < count; ++i) {
      std::ostringstream argName;
      argName << "ARGV" << i;
      const char* arg = this->Makefile->GetDefinition(argName.str());
      if (!arg) {
        this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                     "PARSE_ARGV called with " +
                                       argName.str() + " not set");
        cmSystemTools::SetFatalErrorOccured();
        return true;
      }
      list.emplace_back(arg);
    }
  }

  std::vector<std::string> keywordsMissingValues;

  parser.Parse(list, &unparsed, &keywordsMissingValues);

  PassParsedArguments(
    prefix, *this->Makefile, options, singleValArgs, multiValArgs, unparsed,
    options_set(keywordsMissingValues.begin(), keywordsMissingValues.end()),
    parseFromArgV);

  return true;
}